

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O0

void fai_insert_index(faidx_t *idx,char *name,int len,int line_len,int line_blen,uint64_t offset)

{
  khint_t kVar1;
  char **ppcVar2;
  char *pcVar3;
  faidx1_t *pfVar4;
  int local_54;
  faidx1_t t;
  int ret;
  khint_t k;
  uint64_t offset_local;
  int line_blen_local;
  int line_len_local;
  int len_local;
  char *name_local;
  faidx_t *idx_local;
  
  if (idx->n == idx->m) {
    if (idx->m == 0) {
      local_54 = 0x10;
    }
    else {
      local_54 = idx->m << 1;
    }
    idx->m = local_54;
    ppcVar2 = (char **)realloc(idx->name,(long)idx->m << 3);
    idx->name = ppcVar2;
  }
  pcVar3 = strdup(name);
  idx->name[idx->n] = pcVar3;
  kVar1 = kh_put_s(idx->hash,idx->name[idx->n],(int *)&t.offset);
  pfVar4 = idx->hash->vals + kVar1;
  pfVar4->line_len = line_len;
  pfVar4->line_blen = line_blen;
  pfVar4->len = (long)len;
  pfVar4->offset = offset;
  idx->n = idx->n + 1;
  return;
}

Assistant:

static inline void fai_insert_index(faidx_t *idx, const char *name, int len, int line_len, int line_blen, uint64_t offset)
{
    khint_t k;
    int ret;
    faidx1_t t;
    if (idx->n == idx->m) {
        idx->m = idx->m? idx->m<<1 : 16;
        idx->name = (char**)realloc(idx->name, sizeof(char*) * idx->m);
    }
    idx->name[idx->n] = strdup(name);
    k = kh_put(s, idx->hash, idx->name[idx->n], &ret);
    t.len = len; t.line_len = line_len; t.line_blen = line_blen; t.offset = offset;
    kh_value(idx->hash, k) = t;
    ++idx->n;
}